

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

_Bool upb_MapIterator_Done(upb_Map *map,size_t iter)

{
  _Bool _Var1;
  upb_strtable_iter i;
  upb_strtable_iter local_10;
  
  if (iter == 0xffffffffffffffff) {
    __assert_fail("iter != ((size_t)-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/map.c"
                  ,0x79,"_Bool upb_MapIterator_Done(const upb_Map *, size_t)");
  }
  if (map->is_strtable_dont_copy_me__upb_internal_use_only == true) {
    local_10.t = (upb_strtable *)&map->t;
    local_10.index = iter;
    _Var1 = upb_strtable_done(&local_10);
    return _Var1;
  }
  _Var1 = upb_inttable_done(&(map->t).inttable,iter);
  return _Var1;
}

Assistant:

bool upb_MapIterator_Done(const upb_Map* map, size_t iter) {
  UPB_ASSERT(iter != kUpb_Map_Begin);
  if (map->UPB_PRIVATE(is_strtable)) {
    upb_strtable_iter i;
    i.t = &map->t.strtable;
    i.index = iter;
    return upb_strtable_done(&i);
  } else {
    return upb_inttable_done(&map->t.inttable, iter);
  }
}